

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O3

INT16 ymf278b_getSample(YMF278BChip *chip,YMF278BSlot *slot,UINT16 pos)

{
  UINT8 UVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  UINT32 UVar6;
  ushort uVar7;
  uint uVar8;
  
  UVar1 = slot->bits;
  if (UVar1 != '\x02') {
    if (UVar1 != '\x01') {
      if (UVar1 != '\0') {
        return 0;
      }
      UVar6 = (uint)pos + slot->startaddr & 0x3fffff;
      lVar5 = 0x528;
      if (chip->ROMSize <= UVar6) {
        UVar6 = ymf278b_getRamAddress(chip,UVar6 - chip->ROMSize);
        if (chip->RAMSize <= UVar6) {
          return -0x100;
        }
        lVar5 = 0x538;
      }
      return (ushort)*(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)UVar6) << 8;
    }
    uVar8 = (uint)(pos >> 1) * 3 + slot->startaddr;
    if ((pos & 1) != 0) {
      uVar3 = uVar8 + 2 & 0x3fffff;
      uVar4 = chip->ROMSize;
      lVar5 = 0x528;
      if (uVar3 < uVar4) {
LAB_00155e07:
        uVar7 = (ushort)*(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)uVar3) << 8;
      }
      else {
        uVar3 = ymf278b_getRamAddress(chip,uVar3 - uVar4);
        uVar7 = 0xff00;
        if (uVar3 < chip->RAMSize) {
          lVar5 = 0x538;
          goto LAB_00155e07;
        }
      }
      UVar6 = uVar8 + 1 & 0x3fffff;
      lVar5 = 0x528;
      if (uVar4 <= UVar6) {
        UVar6 = ymf278b_getRamAddress(chip,UVar6 - uVar4);
        uVar2 = 0xf0;
        if (chip->RAMSize <= UVar6) goto LAB_00155e56;
        lVar5 = 0x538;
      }
      uVar2 = *(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)UVar6) & 0xfff0;
      goto LAB_00155e56;
    }
    uVar3 = uVar8 & 0x3fffff;
    uVar4 = chip->ROMSize;
    lVar5 = 0x528;
    if (uVar3 < uVar4) {
LAB_00155ce3:
      uVar7 = (ushort)*(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)uVar3) << 8;
    }
    else {
      uVar3 = ymf278b_getRamAddress(chip,uVar3 - uVar4);
      uVar7 = 0xff00;
      if (uVar3 < chip->RAMSize) {
        lVar5 = 0x538;
        goto LAB_00155ce3;
      }
    }
    UVar6 = uVar8 + 1 & 0x3fffff;
    lVar5 = 0x528;
    if (uVar4 <= UVar6) {
      UVar6 = ymf278b_getRamAddress(chip,UVar6 - uVar4);
      uVar2 = 0xf0;
      if (chip->RAMSize <= UVar6) goto LAB_00155e56;
      lVar5 = 0x538;
    }
    uVar2 = (ushort)(byte)(*(char *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)UVar6) <<
                          4);
LAB_00155e56:
    return uVar2 | uVar7;
  }
  uVar3 = (uint)pos * 2 + slot->startaddr;
  uVar4 = uVar3 & 0x3fffff;
  uVar8 = chip->ROMSize;
  lVar5 = 0x528;
  if (uVar4 < uVar8) {
LAB_00155d78:
    uVar7 = (ushort)*(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)uVar4) << 8;
  }
  else {
    uVar4 = ymf278b_getRamAddress(chip,uVar4 - uVar8);
    uVar7 = 0xff00;
    if (uVar4 < chip->RAMSize) {
      lVar5 = 0x538;
      goto LAB_00155d78;
    }
  }
  UVar6 = uVar3 + 1 & 0x3fffff;
  lVar5 = 0x528;
  if (uVar8 <= UVar6) {
    UVar6 = ymf278b_getRamAddress(chip,UVar6 - uVar8);
    uVar2 = 0xff;
    if (chip->RAMSize <= UVar6) goto LAB_00155dc0;
    lVar5 = 0x538;
  }
  uVar2 = (ushort)*(byte *)(*(long *)((long)chip->slots + lVar5 + -0x20) + (ulong)UVar6);
LAB_00155dc0:
  return uVar2 | uVar7;
}

Assistant:

INLINE INT16 ymf278b_getSample(YMF278BChip* chip, YMF278BSlot* slot, UINT16 pos)
{
	// TODO How does this behave when R#2 bit 0 = 1?
	//      As-if read returns 0xff? (Like for CPU memory reads.) Or is
	//      sound generation blocked at some higher level?
	INT16 sample;
	UINT32 addr;
	
	switch (slot->bits)
	{
	case 0:
		// 8 bit
		sample = ymf278b_readMem(chip, slot->startaddr + pos) << 8;
		break;
	case 1:
		// 12 bit
		addr = slot->startaddr + ((pos / 2) * 3);
		if (pos & 1)
			sample = (ymf278b_readMem(chip, addr + 2) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0xF0) << 0);
		else
			sample = (ymf278b_readMem(chip, addr + 0) << 8) | ((ymf278b_readMem(chip, addr + 1) & 0x0F) << 4);
		break;
	case 2:
		// 16 bit
		addr = slot->startaddr + (pos * 2);
		sample = (ymf278b_readMem(chip, addr + 0) << 8) | ymf278b_readMem(chip, addr + 1);
		break;
	default:
		// TODO unspecified
		sample = 0;
		break;
	}
	return sample;
}